

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ex_stream_file.c
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  ulong uVar2;
  undefined8 uVar3;
  undefined8 *in_RSI;
  undefined8 uVar4;
  int in_EDI;
  ALLEGRO_EVENT_QUEUE *queue;
  ALLEGRO_EVENT event;
  _Bool playing;
  char *filename;
  ALLEGRO_AUDIO_STREAM *stream;
  int arg_start;
  _Bool loop;
  ALLEGRO_MIXER *mixer;
  ALLEGRO_VOICE *voice;
  int i;
  int local_90 [19];
  byte local_41;
  undefined8 local_40;
  long local_38;
  int local_30;
  byte local_29;
  long local_28;
  long local_20;
  int local_14;
  undefined8 *local_10;
  int local_8;
  undefined4 local_4;
  
  local_4 = 0;
  local_29 = 0;
  local_30 = 1;
  local_10 = in_RSI;
  local_8 = in_EDI;
  uVar2 = al_install_system(0x5020700,atexit);
  if ((uVar2 & 1) == 0) {
    abort_example("Could not init Allegro.\n");
  }
  open_log();
  if (local_8 < 2) {
    log_printf("This example needs to be run from the command line.\n");
    log_printf("Usage: %s [--loop] {audio_files}\n",*local_10);
  }
  else {
    iVar1 = strcmp((char *)local_10[1],"--loop");
    if (iVar1 == 0) {
      local_29 = 1;
      local_30 = 2;
    }
    al_init_acodec_addon();
    uVar2 = al_install_audio();
    if ((uVar2 & 1) == 0) {
      abort_example("Could not init sound!\n");
    }
    local_20 = al_create_voice(0xac44,1,0x20);
    if (local_20 == 0) {
      abort_example("Could not create ALLEGRO_VOICE.\n");
    }
    log_printf("Voice created.\n");
    local_28 = al_create_mixer(0xac44,3,0x20);
    if (local_28 == 0) {
      abort_example("Could not create ALLEGRO_MIXER.\n");
    }
    log_printf("Mixer created.\n");
    uVar2 = al_attach_mixer_to_voice(local_28,local_20);
    if ((uVar2 & 1) == 0) {
      abort_example("al_attach_mixer_to_voice failed.\n");
    }
    for (local_14 = local_30; local_14 < local_8; local_14 = local_14 + 1) {
      local_40 = local_10[local_14];
      local_41 = 1;
      uVar3 = al_create_event_queue();
      local_38 = al_load_audio_stream(local_40,4,0x800);
      if (local_38 == 0) {
        log_printf("Could not create an ALLEGRO_AUDIO_STREAM from \'%s\'!\n",local_40);
      }
      else {
        log_printf("Stream created from \'%s\'.\n",local_40);
        if ((local_29 & 1) != 0) {
          uVar4 = 0x100;
          if ((local_29 & 1) != 0) {
            uVar4 = 0x101;
          }
          al_set_audio_stream_playmode(local_38,uVar4);
        }
        uVar4 = al_get_audio_stream_event_source(local_38);
        al_register_event_source(uVar3,uVar4);
        uVar2 = al_attach_audio_stream_to_mixer(local_38,local_28);
        if ((uVar2 & 1) == 0) {
          log_printf("al_attach_audio_stream_to_mixer failed.\n");
        }
        else {
          log_printf("Playing %s ... Waiting for stream to finish ",local_40);
          do {
            al_wait_for_event(uVar3,local_90);
            if (local_90[0] == 0x202) {
              local_41 = 0;
            }
          } while ((local_41 & 1) != 0);
          log_printf("\n");
          al_destroy_event_queue(uVar3);
          al_destroy_audio_stream(local_38);
        }
      }
    }
    log_printf("Done\n");
    al_destroy_mixer(local_28);
    al_destroy_voice(local_20);
    al_uninstall_audio();
  }
  close_log(true);
  return 0;
}

Assistant:

int main(int argc, char **argv)
{
   int i;
   ALLEGRO_VOICE*  voice;
   ALLEGRO_MIXER*  mixer;
   bool loop = false;
   int arg_start = 1;

   if (!al_init()) {
       abort_example("Could not init Allegro.\n");
   }

   open_log();

   if (argc < 2) {
      log_printf("This example needs to be run from the command line.\n");
      log_printf("Usage: %s [--loop] {audio_files}\n", argv[0]);
      goto done;
   }

   if (strcmp(argv[1], "--loop") == 0) {
      loop = true;
      arg_start = 2;
   }

   al_init_acodec_addon();

   if (!al_install_audio()) {
      abort_example("Could not init sound!\n");
   }

   voice = al_create_voice(44100, ALLEGRO_AUDIO_DEPTH_INT16,
                           ALLEGRO_CHANNEL_CONF_2);
   if (!voice) {
      abort_example("Could not create ALLEGRO_VOICE.\n");
   }
   log_printf("Voice created.\n");

#ifndef BYPASS_MIXER
   mixer = al_create_mixer(44100, ALLEGRO_AUDIO_DEPTH_FLOAT32,
                           ALLEGRO_CHANNEL_CONF_2);
   if (!mixer) {
      abort_example("Could not create ALLEGRO_MIXER.\n");
   }
   log_printf("Mixer created.\n");

   if (!al_attach_mixer_to_voice(mixer, voice)) {
      abort_example("al_attach_mixer_to_voice failed.\n");
   }
#endif

   for (i = arg_start; i < argc; ++i)
   {
      ALLEGRO_AUDIO_STREAM* stream;
      const char*     filename = argv[i];
      bool playing = true;
      ALLEGRO_EVENT event;
      ALLEGRO_EVENT_QUEUE* queue = al_create_event_queue();

      stream = al_load_audio_stream(filename, 4, 2048);
      if (!stream) {
         log_printf("Could not create an ALLEGRO_AUDIO_STREAM from '%s'!\n",
                 filename);
         continue;
      }
      log_printf("Stream created from '%s'.\n", filename);
      if (loop) {
         al_set_audio_stream_playmode(stream, loop ? ALLEGRO_PLAYMODE_LOOP : ALLEGRO_PLAYMODE_ONCE);
      }
      
      al_register_event_source(queue, al_get_audio_stream_event_source(stream));

#ifndef BYPASS_MIXER
      if (!al_attach_audio_stream_to_mixer(stream, mixer)) {
         log_printf("al_attach_audio_stream_to_mixer failed.\n");
         continue;
      }
#else
      if (!al_attach_audio_stream_to_voice(stream, voice)) {
         abort_example("al_attach_audio_stream_to_voice failed.\n");
      }
#endif

      log_printf("Playing %s ... Waiting for stream to finish ", filename);
      do {
         al_wait_for_event(queue, &event);
         if(event.type == ALLEGRO_EVENT_AUDIO_STREAM_FINISHED)
            playing = false;
      } while (playing);
      log_printf("\n");

      al_destroy_event_queue(queue);
      al_destroy_audio_stream(stream);
   }
   log_printf("Done\n");

#ifndef BYPASS_MIXER
   al_destroy_mixer(mixer);
#endif
   al_destroy_voice(voice);

   al_uninstall_audio();
done:
   close_log(true);

   return 0;
}